

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Estimators.cc
# Opt level: O3

void __thiscall Estimate::LS::CalcEstimate(LS *this,VectorXd *y)

{
  long cols;
  long rows;
  undefined8 *puVar1;
  ActualDstType actualDst;
  MatrixXd Rinv;
  MatrixXd H;
  assign_op<double,_double> local_79;
  DenseStorage<double,__1,__1,__1,_0> local_78;
  Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_60;
  DenseStorage<double,__1,__1,__1,_0> local_40;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_40,(DenseStorage<double,__1,__1,__1,_0> *)this);
  local_60.m_lhs.m_lhs.m_lhs = &this->R_;
  local_78.m_data = (double *)0x0;
  local_78.m_rows = 0;
  local_78.m_cols = 0;
  cols = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows;
  rows = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_cols;
  if ((cols != 0 && rows != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(cols),0) < rows)) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = std::ios::widen;
    __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_78,cols * rows,rows,cols);
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_78,(SrcXprType *)&local_60,&local_79);
  local_60.m_lhs.m_lhs.m_lhs = (LhsNested)&local_40;
  local_60.m_lhs.m_lhs.m_rhs.m_matrix = (non_const_type)&local_78;
  local_60.m_lhs.m_rhs = (RhsNested)&local_40;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&this->Phat_,(SrcXprType *)&local_60,&local_79);
  local_60.m_lhs.m_lhs.m_lhs = &this->Phat_;
  local_60.m_lhs.m_lhs.m_rhs.m_matrix = (non_const_type)&local_40;
  local_60.m_lhs.m_rhs = (RhsNested)&local_78;
  local_60.m_rhs = y;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
            (&this->xhat_,&local_60,&local_79,(type)0x0);
  free(local_78.m_data);
  free(local_40.m_data);
  return;
}

Assistant:

void LS::CalcEstimate(Eigen::VectorXd y){

		//extract locals
		Eigen::MatrixXd H = this->H_;

		//invert R
		Eigen::MatrixXd Rinv = this->R_.inverse();

		//covariance
		this->Phat_ = (H.transpose()*Rinv*H).inverse();

		//estimate
		this->xhat_ = this->Phat_*H.transpose()*Rinv*y;


	}